

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_lzma.c
# Opt level: O2

void test_option_lzma(void)

{
  wchar_t wVar1;
  char *__haystack;
  char *pcVar2;
  size_t s;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzma.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("echo f | %s -o --lzma >archive.out 2>archive.err",testprog);
  __haystack = slurpfile(&s,"archive.err");
  __haystack[s] = '\0';
  if (wVar1 == L'\0') {
    free(__haystack);
    __haystack = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzma.c"
                     ,L'&',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzma.c"
                        ,L'\'',__haystack,"p","]","\"\\x5d\\00\\00\"",3,"3",(void *)0x0);
  }
  else {
    pcVar2 = strstr(__haystack,"compression not available");
    if (pcVar2 == (char *)0x0) {
      failure("--lzma option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzma.c"
                          ,L'\x1f',(long)wVar1,"r",0,"0",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lzma.c"
                     ,L'\x19');
      test_skipping("This version of bsdcpio was compiled without lzma support");
    }
  }
  free(__haystack);
  return;
}

Assistant:

DEFINE_TEST(test_option_lzma)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lzma compression. */
	r = systemf("echo f | %s -o --lzma >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "compression not available") != NULL) {
			skipping("This version of bsdcpio was compiled "
			    "without lzma support");
			free(p);
			return;
		}
		failure("--lzma option is broken");
		assertEqualInt(r, 0);
		free(p);
		return;
	}
	free(p);
	/* Check that the archive file has an lzma signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x5d\00\00", 3);
	free(p);
}